

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O1

void __thiscall
MaxLengthUTFSequence_Slice_Test::~MaxLengthUTFSequence_Slice_Test
          (MaxLengthUTFSequence_Slice_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (MaxLengthUTFSequence, Slice) {
    std::ptrdiff_t start = 0;
    std::ptrdiff_t end = 1;
    std::tie (start, end) = pstore::utf::slice (str, start, end);
    ASSERT_EQ (0, start);
    ASSERT_EQ (1, end);

    start = 0;
    end = 2;
    std::tie (start, end) = pstore::utf::slice (str, start, end);
    ASSERT_EQ (0, start);
    ASSERT_EQ (3, end);

    start = 0;
    end = 3;
    std::tie (start, end) = pstore::utf::slice (str, start, end);
    ASSERT_EQ (0, start);
    ASSERT_EQ (6, end);

    start = 0;
    end = 4;
    std::tie (start, end) = pstore::utf::slice (str, start, end);
    ASSERT_EQ (0, start);
    ASSERT_EQ (-1, end);

    start = 3;
    end = 3;
    std::tie (start, end) = pstore::utf::slice (str, start, end);
    ASSERT_EQ (6, start);
    ASSERT_EQ (6, end);
}